

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManSpecReduceInit_rec
               (Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vXorLits,int f,int fDualOut)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  iVar1 = Gia_ObjCopyF(p,f,pObj);
  if (iVar1 != -1) {
    return;
  }
  if ((-1 < (int)(uint)*(undefined8 *)pObj) &&
     (uVar2 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar2 != 0x1fffffff)) {
    Gia_ManSpecReduceInit_rec(pNew,p,pObj + -(ulong)uVar2,vXorLits,f,fDualOut);
    Gia_ManSpecReduceInit_rec
              (pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),vXorLits,f,fDualOut);
    iVar1 = Gia_ObjFanin0CopyF(p,f,pObj);
    iVar3 = Gia_ObjCopyF(p,f,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
    iVar3 = Abc_LitNotCond(iVar3,(uint)((ulong)*(undefined8 *)pObj >> 0x3d) & 1);
    iVar1 = Gia_ManHashAnd(pNew,iVar1,iVar3);
    Gia_ObjSetCopyF(p,f,pObj,iVar1);
    Gia_ManSpecBuildInit(pNew,p,pObj,vXorLits,f,fDualOut);
    return;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                ,0x51f,
                "void Gia_ManSpecReduceInit_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int, int)"
               );
}

Assistant:

void Gia_ManSpecReduceInit_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vXorLits, int f, int fDualOut )
{
    if ( ~Gia_ObjCopyF(p, f, pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManSpecReduceInit_rec( pNew, p, Gia_ObjFanin0(pObj), vXorLits, f, fDualOut );
    Gia_ManSpecReduceInit_rec( pNew, p, Gia_ObjFanin1(pObj), vXorLits, f, fDualOut );
    Gia_ObjSetCopyF( p, f, pObj, Gia_ManHashAnd(pNew, Gia_ObjFanin0CopyF(p, f, pObj), Gia_ObjFanin1CopyF(p, f, pObj)) );
    Gia_ManSpecBuildInit( pNew, p, pObj, vXorLits, f, fDualOut );
}